

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

bool __thiscall
trieste::detail::InsideStar<5UL>::match(InsideStar<5UL> *this,NodeIt *it,Node *parent,Match *match)

{
  long *plVar1;
  long lVar2;
  element_type *peVar3;
  int iVar4;
  long lVar5;
  
  do {
    lVar2 = *(long *)&parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
    if (lVar2 == 0) {
      return false;
    }
    lVar5 = 0x18;
    while (lVar5 != 0x40) {
      plVar1 = (long *)((long)((this->types)._M_elems + -3) + lVar5);
      lVar5 = lVar5 + 8;
      if (*(long *)(lVar2 + 0x10) == *plVar1) {
        peVar3 = (this->super_PatternDef).continuation.
                 super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          iVar4 = (*peVar3->_vptr_PatternDef[4])();
          return SUB41(iVar4,0);
        }
        return true;
      }
    }
    parent = (Node *)(lVar2 + 0x48);
  } while( true );
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        NodeDef* p = &*parent;

        while (p)
        {
          for (const auto& type : types)
            if (p->type() == type)
              return match_continuation(it, parent, match);

          p = p->parent();
        }

        return false;
      }